

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimdFloat64x2OperationX86X64.cpp
# Opt level: O0

SIMDValue Js::SIMDFloat64x2Operation::OpMin(SIMDValue *aValue,SIMDValue *bValue)

{
  _x86_SIMDValue _Var1;
  _x86_SIMDValue _Var2;
  anon_union_16_9_4d7543c8_for__SIMDValue_0 aVar3;
  X86SIMDValue tmpbValue;
  X86SIMDValue tmpaValue;
  X86SIMDValue x86Result;
  SIMDValue *bValue_local;
  SIMDValue *aValue_local;
  
  _Var1 = _x86_SIMDValue::ToX86SIMDValue(aValue);
  _Var2 = _x86_SIMDValue::ToX86SIMDValue(bValue);
  register0x00001200 = minpd((undefined1  [16])_Var1.field_0,(undefined1  [16])_Var2.field_0);
  aVar3 = (anon_union_16_9_4d7543c8_for__SIMDValue_0)
          _x86_SIMDValue::ToSIMDValue((_x86_SIMDValue *)((long)&tmpaValue.field_0 + 8));
  return (SIMDValue)aVar3;
}

Assistant:

SIMDValue SIMDFloat64x2Operation::OpMin(const SIMDValue& aValue, const SIMDValue& bValue)
    {
        X86SIMDValue x86Result;
        X86SIMDValue tmpaValue = X86SIMDValue::ToX86SIMDValue(aValue);
        X86SIMDValue tmpbValue = X86SIMDValue::ToX86SIMDValue(bValue);

        // choose the smaller value of the two parameters a and b
        x86Result.m128d_value = _mm_min_pd(tmpaValue.m128d_value, tmpbValue.m128d_value);

        return X86SIMDValue::ToSIMDValue(x86Result);
    }